

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeMemGetIpcHandleFromFileDescriptorExp
          (ze_context_handle_t hContext,uint64_t handle,ze_ipc_mem_handle_t *pIpcHandle)

{
  ze_pfnMemGetIpcHandleFromFileDescriptorExp_t pfnGetIpcHandleFromFileDescriptorExp;
  ze_result_t result;
  ze_ipc_mem_handle_t *pIpcHandle_local;
  uint64_t handle_local;
  ze_context_handle_t hContext_local;
  
  pfnGetIpcHandleFromFileDescriptorExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c548 != (code *)0x0) {
    pfnGetIpcHandleFromFileDescriptorExp._4_4_ = (*DAT_0011c548)(hContext,handle,pIpcHandle);
  }
  return pfnGetIpcHandleFromFileDescriptorExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetIpcHandleFromFileDescriptorExp(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        uint64_t handle,                                ///< [in] file descriptor
        ze_ipc_mem_handle_t* pIpcHandle                 ///< [out] Returned IPC memory handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIpcHandleFromFileDescriptorExp = context.zeDdiTable.MemExp.pfnGetIpcHandleFromFileDescriptorExp;
        if( nullptr != pfnGetIpcHandleFromFileDescriptorExp )
        {
            result = pfnGetIpcHandleFromFileDescriptorExp( hContext, handle, pIpcHandle );
        }
        else
        {
            // generic implementation
        }

        return result;
    }